

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_rsb(TCGContext_conflict1 *tcg_ctx,int size,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 t1_local;
  TCGv_i32 t0_local;
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 0) {
    gen_helper_neon_sub_u8(tcg_ctx,t0,t1,t0);
  }
  else if (size == 1) {
    gen_helper_neon_sub_u16(tcg_ctx,t0,t1,t0);
  }
  else if (size == 2) {
    tcg_gen_sub_i32(tcg_ctx,t0,t1,t0);
  }
  return;
}

Assistant:

static inline void gen_neon_rsb(TCGContext *tcg_ctx, int size, TCGv_i32 t0, TCGv_i32 t1)
{
    switch (size) {
    case 0: gen_helper_neon_sub_u8(tcg_ctx, t0, t1, t0); break;
    case 1: gen_helper_neon_sub_u16(tcg_ctx, t0, t1, t0); break;
    case 2: tcg_gen_sub_i32(tcg_ctx, t0, t1, t0); break;
    default: return;
    }
}